

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O2

FxExpression * __thiscall FxJumpStatement::Resolve(FxJumpStatement *this,FCompileContext *ctx)

{
  FxLoopStatement *pFVar1;
  char *pcVar2;
  TArray<FxJumpStatement_*,_FxJumpStatement_*> *this_00;
  FxJumpStatement *local_10;
  
  if ((this->super_FxExpression).isresolved == false) {
    (this->super_FxExpression).isresolved = true;
    pFVar1 = (FxLoopStatement *)ctx->ControlStmt;
    if (pFVar1 == (FxLoopStatement *)0x0) {
      pcVar2 = "continue";
      if (this->Token == 0x126) {
        pcVar2 = "break";
      }
      FScriptPosition::Message
                (&(this->super_FxExpression).ScriptPosition,2,"\'%s\' outside of a loop",pcVar2);
      (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
      this = (FxJumpStatement *)0x0;
    }
    else {
      if ((pFVar1 == ctx->Loop) || (this->Token == 0x129)) {
        this_00 = &ctx->Loop->Jumps;
      }
      else {
        this_00 = (TArray<FxJumpStatement_*,_FxJumpStatement_*> *)
                  &pFVar1[1].super_FxExpression.ValueType;
      }
      local_10 = this;
      TArray<FxJumpStatement_*,_FxJumpStatement_*>::Push(this_00,&local_10);
    }
  }
  return &this->super_FxExpression;
}

Assistant:

FxExpression *FxJumpStatement::Resolve(FCompileContext &ctx)
{
	CHECKRESOLVED();

	if (ctx.ControlStmt != nullptr)
	{
		if (ctx.ControlStmt == ctx.Loop || Token == TK_Continue)
		{
			ctx.Loop->Jumps.Push(this);
		}
		else
		{
			// break in switch.
			static_cast<FxSwitchStatement*>(ctx.ControlStmt)->Breaks.Push(this);
		}
		return this;
	}
	else
	{
		ScriptPosition.Message(MSG_ERROR, "'%s' outside of a loop", Token == TK_Break ? "break" : "continue");
		delete this;
		return nullptr;
	}
}